

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O2

void anon_unknown.dwarf_7353::RtMidiCustomErrorCallback(Type typ,string *errorText,void *userData)

{
  iterator iVar1;
  
  iVar1 = std::
          _Rb_tree<std::pair<RtMidi_*,_lua_State_*>,_std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
          ::find((_Rb_tree<std::pair<RtMidi_*,_lua_State_*>,_std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
                  *)(anonymous_namespace)::RtMidi_callbacks,(key_type *)userData);
  if (iVar1._M_node == (_Base_ptr)((anonymous_namespace)::RtMidi_callbacks + 8)) {
    std::operator<<((ostream *)&std::cerr,"RtMidi instance not found!\n");
  }
  lua_rawgeti(*(undefined8 *)((long)userData + 8),0xffffd8f0,
              *(undefined4 *)&iVar1._M_node[1]._M_left);
  lua_pushinteger(*(undefined8 *)((long)userData + 8),typ);
  lua_pushlstring(*(undefined8 *)((long)userData + 8),(errorText->_M_dataplus)._M_p,
                  errorText->_M_string_length);
  lua_call(*(undefined8 *)((long)userData + 8),2,0);
  return;
}

Assistant:

void RtMidiCustomErrorCallback(RtMidiError::Type typ, const std::string &errorText, void *userData) {
	auto *rec = reinterpret_cast<RtMidi_callback_rec *>(userData);
	auto it = RtMidi_callbacks.find(*rec);
	if (it == RtMidi_callbacks.end())
		std::cerr << "RtMidi instance not found!\n";

//	if (it != RtMidi_callbacks.end()) {
		lua_rawgeti(rec->second, LUA_REGISTRYINDEX, it->second); // RtMidi_callbackwrapper
		lua_pushinteger(rec->second, typ);
		lua_pushlstring(rec->second, errorText.c_str(), errorText.size());
		lua_call(rec->second, 2, 0);
//	}
//	else {
//		std::cerr << "Function ref not found, falling back to RtMidiDefaultErrorCallback";
//		return RtMidiDefaultErrorCallback(typ, errorText, rec->second);
//	}
}